

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,Variable *var)

{
  size_type sVar1;
  ostream *poVar2;
  const_reference pvVar3;
  uint local_1c;
  uint i;
  Variable *var_local;
  ostream *os_local;
  
  std::operator<<(os,"Values:");
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&var->values_);
    if (sVar1 <= local_1c) break;
    poVar2 = std::operator<<(os," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
    poVar2 = std::operator<<(poVar2,"=");
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&var->values_,(ulong)local_1c);
    std::operator<<(poVar2,(string *)pvVar3);
    local_1c = local_1c + 1;
  }
  std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Variable& var) {
	os << "Values:";
	for (unsigned int i = 0; i < var.values_.size(); i++) {
		os << " " << i << "=" << var.values_[i];
	}
	os << endl;
	return os;
}